

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

vector<Item,_std::allocator<Item>_> * __thiscall
Instance::sorted_items(vector<Item,_std::allocator<Item>_> *__return_storage_ptr__,Instance *this)

{
  std::vector<Item,_std::allocator<Item>_>::vector(__return_storage_ptr__,&this->items);
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<Item*,std::vector<Item,std::allocator<Item>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::__reverse<__gnu_cxx::__normal_iterator<Item*,std::vector<Item,std::allocator<Item>>>>
            ((__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Item> Instance::sorted_items() {
	std::vector<Item> sitems(items);
	std::stable_sort(all(sitems));
	std::reverse(all(sitems));
	return sitems;
}